

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O1

ptr<snapshot> __thiscall raft_functional_common::TestSm::last_snapshot(TestSm *this)

{
  long lVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ptr<snapshot> pVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0xb8));
  if (iVar2 == 0) {
    (this->super_state_machine)._vptr_state_machine = *(_func_int ***)(in_RSI + 0xa8);
    lVar1 = *(long *)(in_RSI + 0xb0);
    *(long *)&(this->preCommits)._M_t._M_impl = lVar1;
    if (lVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0xb8));
    pVar3.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar3.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (ptr<snapshot>)pVar3.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ptr<snapshot> last_snapshot() {
        std::lock_guard<std::mutex> ll(lastSnapshotLock);
        return lastSnapshot;
    }